

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O2

void solve_linear_3x3_system(float *A,float *b,float *ret_x)

{
  undefined1 auVar1 [16];
  int iVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  undefined1 *puVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  undefined1 local_58 [40];
  float A_inv [9];
  
  auVar12 = ZEXT816(0) << 0x40;
  lVar4 = 0;
  while (lVar4 != 3) {
    lVar6 = lVar4 + 1;
    uVar10 = (ulong)((int)lVar4 - 1);
    lVar8 = 0;
    if (lVar6 != 3) {
      lVar8 = lVar6;
    }
    if (lVar6 == 1) {
      uVar10 = 2;
    }
    auVar1 = vfmsub231ss_fma(ZEXT416((uint)(A[lVar8 + 6] * A[uVar10 + 3])),
                             ZEXT416((uint)A[lVar8 + 3]),ZEXT416((uint)A[uVar10 + 6]));
    auVar12 = vfmadd231ss_fma(auVar12,auVar1,ZEXT416((uint)A[lVar4]));
    lVar4 = lVar6;
  }
  puVar7 = local_58;
  lVar4 = 0;
  while (lVar4 != 3) {
    lVar6 = lVar4 + 1;
    iVar11 = (int)lVar6;
    if (lVar6 == 3) {
      iVar11 = 0;
    }
    uVar3 = ((int)lVar4 + 2U) % 3;
    iVar2 = -3;
    lVar4 = 0;
    while (lVar4 != 3) {
      lVar8 = lVar4 + 1;
      iVar5 = iVar2 + 6;
      if (lVar8 == 3) {
        iVar5 = 0;
      }
      iVar9 = iVar2;
      if (lVar8 == 1) {
        iVar9 = 6;
      }
      iVar2 = iVar2 + 3;
      auVar1 = vfmsub231ss_fma(ZEXT416((uint)(A[(uint)(iVar9 + iVar11)] * A[iVar5 + uVar3])),
                               ZEXT416((uint)A[(uint)(iVar5 + iVar11)]),
                               ZEXT416((uint)A[iVar9 + uVar3]));
      *(float *)(puVar7 + lVar4 * 4) = (1.0 / auVar12._0_4_) * auVar1._0_4_;
      lVar4 = lVar8;
    }
    puVar7 = puVar7 + 0xc;
    lVar4 = lVar6;
  }
  ret_x[0] = 0.0;
  ret_x[1] = 0.0;
  ret_x[2] = 0.0;
  puVar7 = local_58;
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    auVar13 = ZEXT464((uint)ret_x[lVar4]);
    for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
      auVar12 = vfmadd231ss_fma(auVar13._0_16_,ZEXT416(*(uint *)(puVar7 + lVar6 * 4)),
                                ZEXT416((uint)b[lVar6]));
      auVar13 = ZEXT1664(auVar12);
      ret_x[lVar4] = auVar12._0_4_;
    }
    puVar7 = puVar7 + 0xc;
  }
  return;
}

Assistant:

void solve_linear_3x3_system(float A[9], float b[3], float ret_x[3]) {

    assert((A != NULL) && (b != NULL) && (ret_x != NULL));

    // computing determinant and inverse determinant of A
    float det = 0.0f;
    for (int i = 0; i < 3; ++i) {
       det += A[0*3 + i] * (A[1*3 + (i+1)%3] * A[2*3 + (i+2)%3] - A[1*3 + (i+2)%3] * A[2*3 + (i+1)%3]);
    }
    float det_inv = 1.0f / det;

    // computing inverse of 3x3 matrix A with inverse determinant
    float A_inv[9];
    for (int i = 0; i < 3; ++i) {
        for (int j = 0; j < 3; ++j) {
            A_inv[i*3 + j] = det_inv * ((A[((j+1)%3)*3 + (i+1)%3] * A[((j+2)%3)*3 + (i+2)%3]) - (A[((j+1)%3)*3 + (i+2)%3] * A[((j+2)%3)*3 + (i+1)%3]));
        }
    }

    // computing solution vector x = A_inv * b
    ret_x[0] = 0.0f;
    ret_x[1] = 0.0f;
    ret_x[2] = 0.0f;
    for (int i = 0; i < 3; ++i) {
        for (int j = 0; j < 3; ++j) {
            ret_x[i] += A_inv[i*3 + j] * b[j];
        }
    }

}